

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O1

void __thiscall
HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  SetKey<int,_Negation<int>_> local_3a;
  Negation<int> local_39;
  Hasher local_38;
  Hasher local_2c;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_20;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HashtableTest_00c230f8;
  local_2c.id_ = 0;
  local_2c.num_hashes_ = 0;
  local_2c.num_compares_ = 0;
  local_38.id_ = 0;
  local_38.num_hashes_ = 0;
  local_38.num_compares_ = 0;
  local_20.id_ = 0;
  local_20.count_ = (int *)0x0;
  (this->ht_).
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c231b8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&(this->ht_).
                      super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_,0,&local_2c,&local_38,&local_39,&local_3a,&local_20);
  (this->ht_).
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c23138;
  return;
}

Assistant:

HashtableTest() : ht_() {}